

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timedependent.hxx
# Opt level: O2

void __thiscall Time::Time(Time *this,double timestep)

{
  Physical::Physical(&this->super_Physical);
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Time_00157730;
  (this->timeObjects).super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->timeObjects).super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->timeObjects).super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->timeEstimators).super__Vector_base<Estimator_*,_std::allocator<Estimator_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->timeEstimators).super__Vector_base<Estimator_*,_std::allocator<Estimator_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->timeEstimators).super__Vector_base<Estimator_*,_std::allocator<Estimator_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->dt = timestep;
  Unit::set(&(this->super_Physical).physicalUnit,0,0,0,1,0,0,0,0);
  std::__cxx11::string::assign((char *)&(this->super_Physical).physicalDescription);
  return;
}

Assistant:

Time(double timestep) {
		dt = timestep; 
		physicalUnit.set(0, 0,0,1,0,0,0,0); // ms
		physicalDescription = "time";
	}